

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.h
# Opt level: O0

void __thiscall FlowGraph::FlowGraph(FlowGraph *this,Func *func,JitArenaAllocator *fgAlloc)

{
  JitArenaAllocator *fgAlloc_local;
  Func *func_local;
  FlowGraph *this_local;
  
  this->alloc = fgAlloc;
  this->blockList = (BasicBlock *)0x0;
  this->tailBlock = (BasicBlock *)0x0;
  this->loopList = (Loop *)0x0;
  this->catchLabelStack = (SList<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->finallyLabelStack = (SList<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->leaveNullLabelStack = (SList<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->regToFinallyEndMap = (RegionToFinallyEndMapType *)0x0;
  this->leaveNullLabelToFinallyLabelMap = (LeaveNullLabelToFinallyLabelMapType *)0x0;
  this->hasBackwardPassInfo = false;
  this->hasLoop = false;
  this->implicitCallFlags = ImplicitCall_HasNoInfo;
  this->func = func;
  this->blockCount = 0;
  return;
}

Assistant:

FlowGraph(Func *func, JitArenaAllocator *fgAlloc) :
        func(func),
        alloc(fgAlloc),
        blockList(nullptr),
        blockCount(0),
        tailBlock(nullptr),
        loopList(nullptr),
        catchLabelStack(nullptr),
        finallyLabelStack(nullptr),
        leaveNullLabelStack(nullptr),
        regToFinallyEndMap(nullptr),
        leaveNullLabelToFinallyLabelMap(nullptr),
        hasBackwardPassInfo(false),
        hasLoop(false),
        implicitCallFlags(Js::ImplicitCall_HasNoInfo)
    {
    }